

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O3

void __thiscall HDual::updateFtran(HDual *this)

{
  HVector *this_00;
  HModel *pHVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (this->invertHint != 0) {
    return;
  }
  uVar2 = rdtsc();
  uVar5 = (undefined4)((ulong)uVar2 >> 0x20);
  auVar3._4_4_ = uVar5;
  auVar3._0_4_ = uVar5;
  auVar3._8_4_ = 0;
  auVar6._0_12_ = auVar3 << 0x20;
  auVar6._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0x10] =
       (auVar6._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  this_00 = &this->column;
  HVector::clear(this_00);
  (this->column).packFlag = true;
  HMatrix::collect_aj(this->matrix,this_00,this->columnIn,1.0);
  HFactor::ftran(this->factor,this_00,this->columnDensity);
  this->alpha = (this->column).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[this->rowOut];
  pHVar1 = this->model;
  uVar2 = rdtsc();
  uVar5 = (undefined4)((ulong)uVar2 >> 0x20);
  auVar4._4_4_ = uVar5;
  auVar4._0_4_ = uVar5;
  auVar4._8_4_ = 0;
  auVar7._0_12_ = auVar4 << 0x20;
  auVar7._12_4_ = 0x45300000;
  (pHVar1->timer).itemTicks[0x10] =
       (((auVar7._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
       (pHVar1->timer).itemStart[0x10]) + (pHVar1->timer).itemTicks[0x10];
  return;
}

Assistant:

void HDual::updateFtran() {
	if (invertHint)
		return;
	model->timer.recordStart(HTICK_FTRAN);
	column.clear();
	column.packFlag = true;
	matrix->collect_aj(column, columnIn, 1);
	factor->ftran(column, columnDensity);
	alpha = column.array[rowOut];
	model->timer.recordFinish(HTICK_FTRAN);
}